

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inner-lib-tests.cpp
# Opt level: O1

void MultiLibTest(bool *result)

{
  long lVar1;
  LibClass *this;
  size_t sVar2;
  undefined8 uVar3;
  ulong uVar4;
  uint64_t memLeakSize;
  size_t memLeakCount;
  uint local_30;
  undefined4 uStack_2c;
  ulong local_28;
  
  __start(false,"",false);
  this = (LibClass *)operator_new(0x50);
  LibClass::LibClass(this);
  __mem_leak_check(&local_28,(uint64_t *)&local_30,false,"",false);
  if (local_28 == 4) {
    lVar1 = CONCAT44(uStack_2c,local_30);
    sVar2 = LibClass::getSizeOfInternalClass();
    if (lVar1 == sVar2 + 0x58) {
      LibClass::doSomething(this);
      __mem_leak_check(&local_28,(uint64_t *)&local_30,false,"",false);
      if (local_28 != 0x2c) {
        uVar3 = 0xf;
        uVar4 = 0x2c;
        goto LAB_0010242c;
      }
      lVar1 = CONCAT44(uStack_2c,local_30);
      sVar2 = LibClass::getSizeOfInternalClass();
      if (lVar1 == sVar2 * 0x15 + 0x58) {
        LibClass::~LibClass(this);
        operator_delete(this,0x50);
        __mem_leak_check(&local_28,(uint64_t *)&local_30,false,"",false);
        if (local_28 != 0x28) {
          uVar3 = 0x13;
          uVar4 = 0x28;
          goto LAB_0010242c;
        }
        lVar1 = CONCAT44(uStack_2c,local_30);
        sVar2 = LibClass::getSizeOfInternalClass();
        if (lVar1 == sVar2 * 0x14) {
          __stop_and_free_all_mem();
          return;
        }
        sVar2 = LibClass::getSizeOfInternalClass();
        uVar4 = (ulong)(uint)((int)sVar2 * 0x14);
        uVar3 = 0x13;
      }
      else {
        sVar2 = LibClass::getSizeOfInternalClass();
        uVar4 = (ulong)((int)sVar2 * 0x15 + 0x58);
        uVar3 = 0xf;
      }
    }
    else {
      sVar2 = LibClass::getSizeOfInternalClass();
      uVar4 = (ulong)((int)sVar2 + 0x58);
      uVar3 = 0xb;
    }
    local_28 = (ulong)local_30;
  }
  else {
    uVar3 = 0xb;
    uVar4 = 4;
  }
LAB_0010242c:
  printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","MultiLibTest",uVar3,
         local_28,uVar4);
  *result = false;
  return;
}

Assistant:

TEST_CASE(MultiLibTest) {

    START_TEST;

    LibClass* libClass = new LibClass();

    CHECK_MEM_LEAK(4, sizeof(LibClass) + sizeof(double) + LibClass::getSizeOfInternalClass());

    libClass->doSomething();

    CHECK_MEM_LEAK(44, sizeof(LibClass) + sizeof(double) + 21*LibClass::getSizeOfInternalClass());

    delete libClass;

    CHECK_MEM_LEAK(40, 20*libClass->getSizeOfInternalClass());

    STOP_TEST;
}